

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStructSet(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  HeapType type_01;
  ulong uVar1;
  value_type *pvVar2;
  long *plVar3;
  Expression *pEVar4;
  Expression *value;
  StructSet *pSVar5;
  Index IStack_30;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1369,"Expression *wasm::TranslateToFuzzReader::makeStructSet(Type)");
  }
  if ((this->mutableStructFields).
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mutableStructFields).
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = Random::
             pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
                       (&this->random,&this->mutableStructFields);
    type_01.id = (pvVar2->first).id;
    uVar1 = *(ulong *)&pvVar2->second;
    plVar3 = (long *)::wasm::HeapType::getStruct();
    type_00.id = *(uintptr_t *)(*plVar3 + (uVar1 & 0xffffffff) * 0x10);
    pEVar4 = makeTrappingRefUse(this,type_01);
    value = make(this,type_00);
    IStack_30 = (Index)uVar1;
    pSVar5 = Builder::makeStructSet(&this->builder,IStack_30,pEVar4,value,Unordered);
    return (Expression *)pSVar5;
  }
  pEVar4 = makeTrivial(this,(Type)0x0);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeStructSet(Type type) {
  assert(type == Type::none);
  if (mutableStructFields.empty()) {
    return makeTrivial(type);
  }
  auto [structType, fieldIndex] = pick(mutableStructFields);
  auto fieldType = structType.getStruct().fields[fieldIndex].type;
  auto* ref = makeTrappingRefUse(structType);
  auto* value = make(fieldType);
  return builder.makeStructSet(fieldIndex, ref, value, MemoryOrder::Unordered);
}